

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcComms.cpp
# Opt level: O0

void __thiscall helics::ipc::IpcComms::closeReceiver(IpcComms *this)

{
  bool bVar1;
  ConnectionStatus CVar2;
  pointer this_00;
  char *pcVar3;
  void *__buf;
  string *in_RDI;
  int in_R8D;
  interprocess_exception *anon_var_0;
  string buffer;
  __single_object rxQueue;
  ActionMessage cmd;
  memory_order __b;
  ActionMessage *in_stack_fffffffffffffe70;
  CommsInterface *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined8 in_stack_fffffffffffffe80;
  route_id rid;
  undefined8 in_stack_fffffffffffffe88;
  action_t startingAction;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  _Alloc_hider in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  ActionMessage *in_stack_fffffffffffffec8;
  
  rid.rid = (BaseType)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  startingAction = (action_t)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  CVar2 = CommsInterface::getRxStatus((CommsInterface *)0x490c21);
  if ((CVar2 != ERRORED) &&
     (CVar2 = CommsInterface::getRxStatus((CommsInterface *)0x490c30), CVar2 != TERMINATED)) {
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               startingAction);
    CVar2 = CommsInterface::getTxStatus((CommsInterface *)0x490c61);
    if (CVar2 == CONNECTED) {
      CommsInterface::transmit(in_stack_fffffffffffffe78,rid,in_stack_fffffffffffffe70);
    }
    else {
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe78);
      if (!bVar1) {
        std::__cxx11::string::string
                  (in_stack_fffffffffffffeb0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea8._M_p);
        stringTranslateToCppName(in_RDI);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x490d06);
        std::
        make_unique<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>>,boost::interprocess::open_only_t_const&,char_const*>
                  ((open_only_t *)in_RDI,(char **)CONCAT44(CVar2,in_stack_fffffffffffffe90));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe70);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe70);
        ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffffec8);
        this_00 = std::
                  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                  ::operator->((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                                *)0x490d64);
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xfffffffffffffea8;
        pcVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x490d78);
        __buf = (void *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  (this_01);
        boost::interprocess::
        message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>::send
                  (this_00,(int)pcVar3,__buf,3,in_R8D);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe70);
        std::
        unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
        ::~unique_ptr((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                       *)this_00);
      }
    }
    ActionMessage::~ActionMessage(in_stack_fffffffffffffe70);
  }
  return;
}

Assistant:

void IpcComms::closeReceiver()
    {
        if ((getRxStatus() == ConnectionStatus::ERRORED) ||
            (getRxStatus() == ConnectionStatus::TERMINATED)) {
            return;
        }
        ActionMessage cmd(CMD_PROTOCOL);
        cmd.messageID = CLOSE_RECEIVER;
        if (getTxStatus() == ConnectionStatus::CONNECTED) {
            transmit(control_route, cmd);
        } else if (!disconnecting) {
            try {
                auto rxQueue = std::make_unique<ipc_queue>(
                    boost::interprocess::open_only,
                    stringTranslateToCppName(localTargetAddress).c_str());
                std::string buffer = cmd.to_string();
                rxQueue->send(buffer.data(), buffer.size(), 3);
            }
            catch (boost::interprocess::interprocess_exception const&) {
                if (!disconnecting) {
                    ipcbackchannel.store(IPC_BACKCHANNEL_DISCONNECT);
                    //  std::cerr << "unable to send close message::" << ipe.what () << std::endl;
                }
            }
        }
    }